

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_ensure_user_space(lws *wsi)

{
  void *pvVar1;
  lws *wsi_local;
  
  if (wsi->protocol != (lws_protocols *)0x0) {
    if ((wsi->protocol->per_session_data_size == 0) || (wsi->user_space != (void *)0x0)) {
      _lws_log(0x10,"%s: %p protocol pss %lu, user_space=%p\n","lws_ensure_user_space",wsi,
               wsi->protocol->per_session_data_size,wsi->user_space);
    }
    else {
      pvVar1 = lws_zalloc(wsi->protocol->per_session_data_size,"user space");
      wsi->user_space = pvVar1;
      if (wsi->user_space == (void *)0x0) {
        _lws_log(1,"%s: OOM\n","lws_ensure_user_space");
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
lws_ensure_user_space(struct lws *wsi)
{
	if (!wsi->protocol)
		return 0;

	/* allocate the per-connection user memory (if any) */

	if (wsi->protocol->per_session_data_size && !wsi->user_space) {
		wsi->user_space = lws_zalloc(
			    wsi->protocol->per_session_data_size, "user space");
		if (wsi->user_space == NULL) {
			lwsl_err("%s: OOM\n", __func__);
			return 1;
		}
	} else
		lwsl_debug("%s: %p protocol pss %lu, user_space=%p\n", __func__,
			   wsi, (long)wsi->protocol->per_session_data_size,
			   wsi->user_space);
	return 0;
}